

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

int mbedtls_ssl_flush_output(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  uint ret;
  size_t sVar2;
  int line;
  int iVar3;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x936,"=> flush output");
  if (ssl->f_send == (mbedtls_ssl_send_t *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x939,"Bad usage of mbedtls_ssl_set_bio() ");
    iVar3 = -0x7100;
  }
  else {
    sVar2 = ssl->out_left;
    if (sVar2 == 0) {
      line = 0x93f;
    }
    else {
      while (sVar2 != 0) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x946,"message length: %zu, out_left: %zu",
                   ssl->out_iv + (ssl->out_msglen - (long)ssl->out_hdr),sVar2);
        ret = (*ssl->f_send)(ssl->p_bio,ssl->out_hdr + -ssl->out_left,ssl->out_left);
        mbedtls_debug_print_ret
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x94b,"ssl->f_send",ret);
        if ((int)ret < 1) {
          return ret;
        }
        uVar1 = ssl->out_left;
        sVar2 = uVar1 - ret;
        if (uVar1 < ret) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x955,"f_send returned %d bytes but only %zu bytes were sent",(ulong)ret,uVar1
                    );
          return -0x6c00;
        }
        ssl->out_left = sVar2;
      }
      ssl->out_hdr = ssl->out_buf + (ulong)(ssl->conf->transport != '\x01') * 8;
      mbedtls_ssl_update_out_pointers(ssl,ssl->transform_out);
      line = 0x966;
    }
    iVar3 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,line,"<= flush output");
  }
  return iVar3;
}

Assistant:

int mbedtls_ssl_flush_output(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *buf;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> flush output"));

    if (ssl->f_send == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("Bad usage of mbedtls_ssl_set_bio() "));
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    /* Avoid incrementing counter if data is flushed */
    if (ssl->out_left == 0) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("<= flush output"));
        return 0;
    }

    while (ssl->out_left > 0) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("message length: %" MBEDTLS_PRINTF_SIZET
                                  ", out_left: %" MBEDTLS_PRINTF_SIZET,
                                  mbedtls_ssl_out_hdr_len(ssl) + ssl->out_msglen, ssl->out_left));

        buf = ssl->out_hdr - ssl->out_left;
        ret = ssl->f_send(ssl->p_bio, buf, ssl->out_left);

        MBEDTLS_SSL_DEBUG_RET(2, "ssl->f_send", ret);

        if (ret <= 0) {
            return ret;
        }

        if ((size_t) ret > ssl->out_left) {
            MBEDTLS_SSL_DEBUG_MSG(1,
                                  ("f_send returned %d bytes but only %" MBEDTLS_PRINTF_SIZET
                                   " bytes were sent",
                                   ret, ssl->out_left));
            return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        }

        ssl->out_left -= ret;
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        ssl->out_hdr = ssl->out_buf;
    } else
#endif
    {
        ssl->out_hdr = ssl->out_buf + 8;
    }
    mbedtls_ssl_update_out_pointers(ssl, ssl->transform_out);

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= flush output"));

    return 0;
}